

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared-validator.cc
# Opt level: O2

Result __thiscall wabt::SharedValidator::OnTag(SharedValidator *this,Location *loc,Var *sig_var)

{
  Result RVar1;
  Result RVar2;
  bool bVar3;
  FuncType type;
  _Vector_base<wabt::Type,_std::allocator<wabt::Type>_> local_d0;
  FuncType local_b8;
  Var local_78;
  
  local_b8.results.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_b8.results.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_b8.params.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_b8.results.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_b8.params.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_b8.params.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  Var::Var(&local_78,sig_var);
  RVar1 = CheckFuncTypeIndex(this,&local_78,&local_b8);
  bVar3 = RVar1.enum_ == Error;
  Var::~Var(&local_78);
  if (local_b8.results.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_b8.results.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    RVar2 = PrintError(this,loc,"Tag signature must have 0 results.");
    bVar3 = RVar2.enum_ == Error || RVar1.enum_ == Error;
  }
  std::vector<wabt::Type,_std::allocator<wabt::Type>_>::vector
            ((vector<wabt::Type,_std::allocator<wabt::Type>_> *)&local_d0,&local_b8.params);
  std::vector<wabt::SharedValidator::TagType,_std::allocator<wabt::SharedValidator::TagType>_>::
  emplace_back<wabt::SharedValidator::TagType>(&this->tags_,(TagType *)&local_d0);
  std::_Vector_base<wabt::Type,_std::allocator<wabt::Type>_>::~_Vector_base(&local_d0);
  FuncType::~FuncType(&local_b8);
  return (Result)(uint)bVar3;
}

Assistant:

Result SharedValidator::OnTag(const Location& loc, Var sig_var) {
  Result result = Result::Ok;
  FuncType type;
  result |= CheckFuncTypeIndex(sig_var, &type);
  if (!type.results.empty()) {
    result |= PrintError(loc, "Tag signature must have 0 results.");
  }
  tags_.push_back(TagType{type.params});
  return result;
}